

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O1

double minimax::ABeta_<uttt::IBoard,uttt::Eval1>(IBoard *game,int depth,double alfa,double beta)

{
  bool bVar1;
  pointer plVar2;
  IPlayer IVar3;
  int iVar4;
  pointer plVar5;
  byte bVar6;
  double dVar7;
  ulong in_XMM0_Qb;
  ulong extraout_XMM0_Qb;
  ulong in_XMM1_Qb;
  Eval1 evaluator;
  long m;
  IBoard new_game;
  vector<long,_std::allocator<long>_> moves;
  Eval1 local_b1;
  double local_b0;
  double local_a8;
  ulong uStack_a0;
  long local_90;
  double local_88;
  ulong uStack_80;
  double local_78;
  ulong uStack_70;
  IBoard local_68;
  vector<long,_std::allocator<long>_> local_48;
  
  local_a8 = alfa;
  local_88 = beta;
  if (depth == 0) {
    local_b0 = uttt::Eval1::operator()(&local_b1,game);
  }
  else {
    uStack_a0 = in_XMM0_Qb;
    uStack_80 = in_XMM1_Qb;
    iVar4 = uttt::IBoard::GetStatus(game);
    if (iVar4 == -1) {
      uttt::IBoard::GetPossibleMoves(&local_48,game);
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        local_b0 = 0.0;
      }
      else {
        local_78 = -local_88;
        uStack_70 = uStack_80 ^ 0x8000000000000000;
        local_b0 = 0.0;
        bVar6 = 0;
        plVar2 = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          plVar5 = plVar2 + 1;
          local_90 = *plVar2;
          local_68._16_8_ = *(undefined8 *)((game->micro)._M_elems + 6);
          local_68.macro = game->macro;
          local_68.micro._M_elems[0] = (game->micro)._M_elems[0];
          local_68.micro._M_elems[1] = (game->micro)._M_elems[1];
          local_68.micro._M_elems._4_8_ = *(undefined8 *)((game->micro)._M_elems + 2);
          uttt::IBoard::ApplyMove(&local_68,&local_90);
          dVar7 = ABeta_<uttt::IBoard,uttt::Eval1>(&local_68,depth + -1,local_78,-local_a8);
          dVar7 = -dVar7;
          bVar1 = (bool)(bVar6 & dVar7 <= local_b0);
          if (!bVar1) {
            local_b0 = dVar7;
          }
          if (dVar7 <= local_a8) {
            dVar7 = local_a8;
          }
          if (!bVar1) {
            bVar6 = 1;
          }
        } while ((dVar7 < local_88) &&
                (plVar2 = plVar5, local_a8 = dVar7,
                uStack_a0 = extraout_XMM0_Qb ^ 0x8000000000000000,
                plVar5 != local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish));
      }
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      local_b0 = 0.0;
      if (iVar4 != 0) {
        IVar3 = uttt::IBoard::GetPlayerToMove(game);
        local_b0 = *(double *)(&DAT_00151090 + (ulong)(iVar4 == IVar3) * 8);
      }
    }
  }
  return local_b0;
}

Assistant:

static double
ABeta_(const IGame &game, int depth, double alfa, double beta)
{
    Eval evaluator;

    if (depth == 0)
        return evaluator(game);

    auto status = game.GetStatus();
    if (status != game::Undecided)
    {
        if (status == game::Draw)
            return 0.0;
        if (status == game.GetPlayerToMove())
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }

    bool result_set = false;
    double result = 0.0;
    auto moves = game.GetPossibleMoves();
    for (auto m : moves)
    {
        IGame new_game(game);
        new_game.ApplyMove(m);
        auto r = -ABeta_<IGame, Eval>(new_game, depth - 1, -beta, -alfa);
        if (!result_set || r > result)
            result = r, result_set = true;
        alfa = std::max(alfa, r);
        if (alfa >= beta)
            break;
    }

    return result;
}